

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

ByteData *
cfd::core::ConvertBitcoinTxFromWally
          (ByteData *__return_storage_ptr__,wally_tx *tx,bool force_exclude_witness)

{
  wally_tx_input *pwVar1;
  size_t __n;
  uint32_t flags_00;
  wally_tx *tx_00;
  CfdException *pCVar2;
  size_type len;
  uchar *puVar3;
  char *pcVar4;
  uint local_324;
  ulong local_320;
  CfdError *except;
  exception *except_1;
  allocator local_241;
  string local_240;
  CfdSourceLocation local_220;
  undefined1 local_202;
  allocator local_201;
  string local_200;
  CfdSourceLocation local_1e0;
  wally_tx_witness_item *local_1c8;
  wally_tx_witness_item *stack_1;
  uint32_t j_1;
  uint32_t num_items_1;
  wally_tx_input *input_3;
  wally_tx_output *pwStack_1a8;
  uint32_t i_5;
  wally_tx_output *output_1;
  wally_tx_input *pwStack_198;
  uint32_t i_4;
  wally_tx_input *input_2;
  undefined1 local_188 [4];
  uint32_t i_3;
  Serializer builder;
  wally_tx_witness_item *stack;
  uint32_t j;
  size_t num_items;
  wally_tx_input *input_1;
  uint32_t i_2;
  wally_tx_output *output;
  uint32_t i_1;
  wally_tx_input *input;
  uint32_t uStack_118;
  uint32_t i;
  size_t need_size;
  int local_108;
  char *local_100;
  undefined4 local_f4;
  size_t local_f0;
  size_t tx_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  string local_c0;
  CfdSourceLocation local_a0;
  size_t local_88;
  size_t size;
  undefined1 local_75;
  uint32_t flags;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  size_t local_28;
  size_t witness_count;
  int ret;
  bool force_exclude_witness_local;
  wally_tx *tx_local;
  
  local_28 = 0;
  witness_count._7_1_ = force_exclude_witness;
  _ret = tx;
  tx_local = (wally_tx *)__return_storage_ptr__;
  witness_count._0_4_ = wally_tx_get_witness_count(tx,&local_28);
  if ((int)witness_count != 0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x3ca;
    local_40.funcname = "ConvertBitcoinTxFromWally";
    logger::warn<int&>(&local_40,"wally_tx_get_witness_count NG[{}]",(int *)&witness_count);
    local_75 = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"psbt witness count get error.",&local_61);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_60);
    local_75 = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  size._4_4_ = (uint)(local_28 != 0);
  if ((witness_count._7_1_ & 1) != 0) {
    size._4_4_ = 0;
  }
  local_88 = 0;
  witness_count._0_4_ = wally_tx_get_length(_ret,size._4_4_,&local_88);
  __n = local_88;
  if ((int)witness_count != 0) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x3d4;
    local_a0.funcname = "ConvertBitcoinTxFromWally";
    logger::warn<int&>(&local_a0,"wally_tx_get_length NG[{}]",(int *)&witness_count);
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_c0,"psbt tx size get error.",
               (allocator *)
               ((long)&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_c0);
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&tx_size + 7));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (local_e0,__n,(allocator<unsigned_char> *)((long)&tx_size + 7));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&tx_size + 7));
  tx_00 = _ret;
  flags_00 = size._4_4_;
  local_f0 = 0;
  if (local_88 < 0x14) {
    witness_count._0_4_ = -2;
  }
  else {
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_e0);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_e0);
    witness_count._0_4_ = wally_tx_to_bytes(tx_00,flags_00,puVar3,len,&local_f0);
  }
  if ((int)witness_count == 0) {
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_e0);
    ByteData::ByteData(__return_storage_ptr__,puVar3,(uint32_t)local_f0);
    local_f4 = 1;
  }
  else {
    if ((int)witness_count != -2) {
      local_220.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                   ,0x2f);
      local_220.filename = local_220.filename + 1;
      local_220.line = 0x437;
      local_220.funcname = "ConvertBitcoinTxFromWally";
      logger::warn<int&>(&local_220,"wally_tx_to_bytes NG[{}].",(int *)&witness_count);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_240,"psbt tx hex convert error.",&local_241);
      CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_240);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((_ret->num_inputs != 0) && (_ret->num_outputs != 0)) {
      local_1e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                   ,0x2f);
      local_1e0.filename = local_1e0.filename + 1;
      local_1e0.line = 0x433;
      local_1e0.funcname = "ConvertBitcoinTxFromWally";
      logger::warn<int&>(&local_1e0,"wally_tx_to_bytes NG[{}].",(int *)&witness_count);
      local_202 = 1;
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_200,"tx hex convert error.",&local_201);
      CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_200);
      local_202 = 0;
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pcVar4 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                     ,0x2f);
    need_size = (size_t)(pcVar4 + 1);
    local_108 = 0x3eb;
    local_100 = "ConvertBitcoinTxFromWally";
    logger::info<unsigned_long&>
              ((CfdSourceLocation *)&need_size,"wally_tx_get_length size[{}]",&local_88);
    _uStack_118 = _ret->num_outputs * 0x70 + _ret->num_inputs * 0xd0 + 0x38;
    for (input._4_4_ = 0; (ulong)input._4_4_ < _ret->num_inputs; input._4_4_ = input._4_4_ + 1) {
      _uStack_118 = _ret->inputs[input._4_4_].script_len + 10 + _uStack_118;
    }
    for (output._4_4_ = 0; (ulong)output._4_4_ < _ret->num_outputs; output._4_4_ = output._4_4_ + 1)
    {
      _uStack_118 = _ret->outputs[output._4_4_].script_len + 10 + _uStack_118;
    }
    if (size._4_4_ != 0) {
      for (input_1._4_4_ = 0; (ulong)input_1._4_4_ < _ret->num_inputs;
          input_1._4_4_ = input_1._4_4_ + 1) {
        pwVar1 = _ret->inputs;
        if (pwVar1[input_1._4_4_].witness == (wally_tx_witness_stack *)0x0) {
          local_320 = 0;
        }
        else {
          local_320 = (pwVar1[input_1._4_4_].witness)->num_items;
        }
        for (stack._4_4_ = 0; stack._4_4_ < local_320; stack._4_4_ = stack._4_4_ + 1) {
          builder._32_8_ = (pwVar1[input_1._4_4_].witness)->items + stack._4_4_;
          _uStack_118 = ((wally_tx_witness_item *)builder._32_8_)->witness_len + 10 + _uStack_118;
        }
        _uStack_118 = _uStack_118 + 10;
      }
    }
    Serializer::Serializer((Serializer *)local_188,uStack_118);
    Serializer::AddDirectNumber((Serializer *)local_188,_ret->version);
    if ((size._4_4_ != 0) && (_ret->num_inputs != 0)) {
      Serializer::AddDirectByte((Serializer *)local_188,'\0');
      Serializer::AddDirectByte((Serializer *)local_188,'\x01');
    }
    Serializer::AddVariableInt((Serializer *)local_188,_ret->num_inputs);
    for (input_2._4_4_ = 0; (ulong)input_2._4_4_ < _ret->num_inputs;
        input_2._4_4_ = input_2._4_4_ + 1) {
      pwStack_198 = _ret->inputs + input_2._4_4_;
      Serializer::AddDirectBytes((Serializer *)local_188,pwStack_198->txhash,0x20);
      Serializer::AddDirectNumber((Serializer *)local_188,pwStack_198->index);
      Serializer::AddVariableBuffer
                ((Serializer *)local_188,pwStack_198->script,(uint32_t)pwStack_198->script_len);
      Serializer::AddDirectNumber((Serializer *)local_188,pwStack_198->sequence);
    }
    Serializer::AddVariableInt((Serializer *)local_188,_ret->num_outputs);
    for (output_1._4_4_ = 0; (ulong)output_1._4_4_ < _ret->num_outputs;
        output_1._4_4_ = output_1._4_4_ + 1) {
      pwStack_1a8 = _ret->outputs + output_1._4_4_;
      Serializer::AddDirectNumber((Serializer *)local_188,pwStack_1a8->satoshi);
      Serializer::AddVariableBuffer
                ((Serializer *)local_188,pwStack_1a8->script,(uint32_t)pwStack_1a8->script_len);
    }
    if (size._4_4_ != 0) {
      for (input_3._4_4_ = 0; (ulong)input_3._4_4_ < _ret->num_inputs;
          input_3._4_4_ = input_3._4_4_ + 1) {
        _j_1 = _ret->inputs + input_3._4_4_;
        if (_j_1->witness == (wally_tx_witness_stack *)0x0) {
          local_324 = 0;
        }
        else {
          local_324 = (uint)_j_1->witness->num_items;
        }
        stack_1._4_4_ = local_324;
        Serializer::AddVariableInt((Serializer *)local_188,(ulong)local_324);
        for (stack_1._0_4_ = 0; (uint)stack_1 < stack_1._4_4_; stack_1._0_4_ = (uint)stack_1 + 1) {
          local_1c8 = _j_1->witness->items + (uint)stack_1;
          Serializer::AddVariableBuffer
                    ((Serializer *)local_188,local_1c8->witness,(uint32_t)local_1c8->witness_len);
        }
      }
    }
    Serializer::AddDirectNumber((Serializer *)local_188,_ret->locktime);
    Serializer::Output(__return_storage_ptr__,(Serializer *)local_188);
    local_f4 = 1;
    Serializer::~Serializer((Serializer *)local_188);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_e0);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConvertBitcoinTxFromWally(
    const struct wally_tx *tx, bool force_exclude_witness) {
  int ret;
  size_t witness_count = 0;
  ret = wally_tx_get_witness_count(tx, &witness_count);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_witness_count NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt witness count get error.");
  }

  uint32_t flags = (witness_count != 0) ? WALLY_TX_FLAG_USE_WITNESS : 0;
  if (force_exclude_witness) flags = 0;

  size_t size = 0;
  ret = wally_tx_get_length(tx, flags, &size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt tx size get error.");
  }

  try {
    std::vector<uint8_t> buf(size);
    size_t tx_size = 0;

    if (size < kTransactionMinimumHexSize) {
      ret = WALLY_EINVAL;
    } else {
      ret = wally_tx_to_bytes(tx, flags, buf.data(), buf.size(), &tx_size);
    }

    if (ret == WALLY_OK) {
      return ByteData(buf.data(), static_cast<uint32_t>(tx_size));
    } else if (ret == WALLY_EINVAL) {
      /* TODO: About conversion to the object.
      * In libwally, txin / txout does not allow empty data.
      * Therefore, if txin / txout is empty, object to byte is an error.
      * Therefore, it performs its own processing under certain circumstances.
      */
      if ((tx->num_inputs == 0) || (tx->num_outputs == 0)) {
        info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
        // Necessary size calculation because wally_tx_get_length may be
        // an invalid value (reserved more)
        size_t need_size = sizeof(struct wally_tx);
        need_size += tx->num_inputs * sizeof(struct wally_tx_input);
        need_size += tx->num_outputs * sizeof(struct wally_tx_output);
        for (uint32_t i = 0; i < tx->num_inputs; ++i) {
          const struct wally_tx_input *input = tx->inputs + i;
          need_size += input->script_len + 10;
        }
        for (uint32_t i = 0; i < tx->num_outputs; ++i) {
          const struct wally_tx_output *output = tx->outputs + i;
          need_size += output->script_len + 10;
        }
        if (flags != 0) {
          for (uint32_t i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items = input->witness ? input->witness->num_items : 0;
            for (uint32_t j = 0; j < num_items; ++j) {
              const struct wally_tx_witness_item *stack;
              stack = input->witness->items + j;
              need_size += stack->witness_len + 10;
            }
            need_size += 10;
          }
        }

        Serializer builder(static_cast<uint32_t>(need_size));
        builder.AddDirectNumber(tx->version);
        if ((flags != 0) && (tx->num_inputs != 0)) {  // witness
          builder.AddDirectByte(0);                   // marker is 0
          builder.AddDirectByte(1);                   // flag is 1(witness)
        }

        builder.AddVariableInt(tx->num_inputs);
        for (uint32_t i = 0; i < tx->num_inputs; ++i) {
          const struct wally_tx_input *input = tx->inputs + i;
          builder.AddDirectBytes(input->txhash, sizeof(input->txhash));
          builder.AddDirectNumber(input->index);
          builder.AddVariableBuffer(
              input->script, static_cast<uint32_t>(input->script_len));
          builder.AddDirectNumber(input->sequence);
        }

        builder.AddVariableInt(tx->num_outputs);
        for (uint32_t i = 0; i < tx->num_outputs; ++i) {
          const struct wally_tx_output *output = tx->outputs + i;
          builder.AddDirectNumber(output->satoshi);
          builder.AddVariableBuffer(
              output->script, static_cast<uint32_t>(output->script_len));
        }

        if (flags != 0) {  // witness
          for (uint32_t i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            uint32_t num_items =
                input->witness
                    ? static_cast<uint32_t>(input->witness->num_items)
                    : 0;
            builder.AddVariableInt(num_items);
            for (uint32_t j = 0; j < num_items; ++j) {
              const struct wally_tx_witness_item *stack;
              stack = input->witness->items + j;
              builder.AddVariableBuffer(
                  stack->witness, static_cast<uint32_t>(stack->witness_len));
            }
          }
        }

        builder.AddDirectNumber(tx->locktime);
        return builder.Output();
      } else {
        warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
        throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
      }
    } else {
      warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "psbt tx hex convert error.");
    }
  } catch (const CfdError &except) {
    throw except;
  } catch (const std::exception &except) {
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdUnknownError, std::string(except.what()));
  } catch (...) {
    warn(CFD_LOG_SOURCE, "unknown error.");
    throw CfdException();
  }
}